

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

CommandLine<Catch::ConfigData> * Catch::makeCommandLineParser(void)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  Arg *pAVar3;
  IArgFunction<Catch::ConfigData> *pIVar4;
  CommandLine<Catch::ConfigData> *in_RDI;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  BoundArgFunction<Catch::ConfigData> local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  _Alloc_hider local_68 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  pIVar4 = (IArgFunction<Catch::ConfigData> *)operator_new(8);
  pIVar4->_vptr_IArgFunction = (_func_int **)&PTR__IArgFunction_001b1348;
  (in_RDI->m_boundProcessName).functionObj = pIVar4;
  (in_RDI->m_options).
  super__Vector_base<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (in_RDI->m_options).
  super__Vector_base<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->m_options).
  super__Vector_base<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var1 = &(in_RDI->m_positionalArgs)._M_t._M_impl.super__Rb_tree_header;
  (in_RDI->m_positionalArgs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (in_RDI->m_positionalArgs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (in_RDI->m_positionalArgs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (in_RDI->m_positionalArgs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  *(undefined8 *)
   ((long)&(in_RDI->m_floatingArg)._M_t.
           super___uniq_ptr_impl<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
           .super__Head_base<0UL,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_false>.
           _M_head_impl + 5) = 0;
  (in_RDI->m_positionalArgs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (in_RDI->m_floatingArg)._M_t.
  super___uniq_ptr_impl<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
  ._M_t.
  super__Tuple_impl<0UL,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
  .super__Head_base<0UL,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_false>._M_head_impl =
       (Arg *)0x0;
  Clara::CommandLine<Catch::ConfigData>::bindProcessName<Catch::ConfigData,std::__cxx11::string>
            (in_RDI,0x68);
  local_78._M_allocated_capacity = (size_type)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-?","");
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)&local_80,(string *)in_RDI);
  local_58._M_allocated_capacity = (size_type)&local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"-h","");
  Clara::addOptName((Arg *)local_80.functionObj,(string *)&local_58);
  pcVar2 = local_a0 + 0x10;
  local_a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"--help","");
  Clara::addOptName((Arg *)local_80.functionObj,(string *)local_a0);
  pAVar3 = (Arg *)(local_c0 + 0x10);
  local_c0._0_8_ = pAVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"display usage information","")
  ;
  std::__cxx11::string::_M_assign((string *)(local_80.functionObj + 1));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)&local_80,7);
  if ((Arg *)local_c0._0_8_ != pAVar3) {
    operator_delete((void *)local_c0._0_8_,(ulong)(local_c0._16_8_ + 1));
  }
  if ((pointer)local_a0._0_8_ != pcVar2) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_allocated_capacity != &local_48) {
    operator_delete((void *)local_58._M_allocated_capacity,
                    (ulong)(local_48._M_allocated_capacity + 1));
  }
  if ((_Alloc_hider *)local_78._M_allocated_capacity != local_68) {
    operator_delete((void *)local_78._M_allocated_capacity,(ulong)(local_68[0]._M_p + 1));
  }
  local_78._M_allocated_capacity = (size_type)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-l","");
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_c0,(string *)in_RDI);
  local_58._M_allocated_capacity = (size_type)&local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"--list-tests","");
  Clara::addOptName((Arg *)local_c0._0_8_,(string *)&local_58);
  local_a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a0,"list all/matching test cases","");
  std::__cxx11::string::_M_assign((string *)(local_c0._0_8_ + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)local_c0,0);
  if ((pointer)local_a0._0_8_ != pcVar2) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_allocated_capacity != &local_48) {
    operator_delete((void *)local_58._M_allocated_capacity,
                    (ulong)(local_48._M_allocated_capacity + 1));
  }
  if ((_Alloc_hider *)local_78._M_allocated_capacity != local_68) {
    operator_delete((void *)local_78._M_allocated_capacity,(ulong)(local_68[0]._M_p + 1));
  }
  local_78._M_allocated_capacity = (size_type)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-t","");
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_c0,(string *)in_RDI);
  local_58._M_allocated_capacity = (size_type)&local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"--list-tags","");
  Clara::addOptName((Arg *)local_c0._0_8_,(string *)&local_58);
  local_a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"list all/matching tags","");
  std::__cxx11::string::_M_assign((string *)(local_c0._0_8_ + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)local_c0,1);
  if ((pointer)local_a0._0_8_ != pcVar2) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_allocated_capacity != &local_48) {
    operator_delete((void *)local_58._M_allocated_capacity,
                    (ulong)(local_48._M_allocated_capacity + 1));
  }
  if ((_Alloc_hider *)local_78._M_allocated_capacity != local_68) {
    operator_delete((void *)local_78._M_allocated_capacity,(ulong)(local_68[0]._M_p + 1));
  }
  local_78._M_allocated_capacity = (size_type)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-s","");
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_c0,(string *)in_RDI);
  local_58._M_allocated_capacity = (size_type)&local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"--success","");
  Clara::addOptName((Arg *)local_c0._0_8_,(string *)&local_58);
  local_a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a0,"include successful tests in output","");
  std::__cxx11::string::_M_assign((string *)(local_c0._0_8_ + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)local_c0,4);
  if ((pointer)local_a0._0_8_ != pcVar2) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_allocated_capacity != &local_48) {
    operator_delete((void *)local_58._M_allocated_capacity,
                    (ulong)(local_48._M_allocated_capacity + 1));
  }
  if ((_Alloc_hider *)local_78._M_allocated_capacity != local_68) {
    operator_delete((void *)local_78._M_allocated_capacity,(ulong)(local_68[0]._M_p + 1));
  }
  local_78._M_allocated_capacity = (size_type)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-b","");
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_c0,(string *)in_RDI);
  local_58._M_allocated_capacity = (size_type)&local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"--break","");
  Clara::addOptName((Arg *)local_c0._0_8_,(string *)&local_58);
  local_a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a0,"break into debugger on failure","");
  std::__cxx11::string::_M_assign((string *)(local_c0._0_8_ + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)local_c0,5);
  if ((pointer)local_a0._0_8_ != pcVar2) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_allocated_capacity != &local_48) {
    operator_delete((void *)local_58._M_allocated_capacity,
                    (ulong)(local_48._M_allocated_capacity + 1));
  }
  if ((_Alloc_hider *)local_78._M_allocated_capacity != local_68) {
    operator_delete((void *)local_78._M_allocated_capacity,(ulong)(local_68[0]._M_p + 1));
  }
  local_78._M_allocated_capacity = (size_type)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-e","");
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_c0,(string *)in_RDI);
  local_58._M_allocated_capacity = (size_type)&local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"--nothrow","");
  Clara::addOptName((Arg *)local_c0._0_8_,(string *)&local_58);
  local_a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"skip exception tests","");
  std::__cxx11::string::_M_assign((string *)(local_c0._0_8_ + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)local_c0,6);
  if ((pointer)local_a0._0_8_ != pcVar2) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_allocated_capacity != &local_48) {
    operator_delete((void *)local_58._M_allocated_capacity,
                    (ulong)(local_48._M_allocated_capacity + 1));
  }
  if ((_Alloc_hider *)local_78._M_allocated_capacity != local_68) {
    operator_delete((void *)local_78._M_allocated_capacity,(ulong)(local_68[0]._M_p + 1));
  }
  local_78._M_allocated_capacity = (size_type)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-i","");
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_c0,(string *)in_RDI);
  local_58._M_allocated_capacity = (size_type)&local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"--invisibles","");
  Clara::addOptName((Arg *)local_c0._0_8_,(string *)&local_58);
  local_a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a0,"show invisibles (tabs, newlines)","");
  std::__cxx11::string::_M_assign((string *)(local_c0._0_8_ + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)local_c0,8);
  if ((pointer)local_a0._0_8_ != pcVar2) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_allocated_capacity != &local_48) {
    operator_delete((void *)local_58._M_allocated_capacity,
                    (ulong)(local_48._M_allocated_capacity + 1));
  }
  if ((_Alloc_hider *)local_78._M_allocated_capacity != local_68) {
    operator_delete((void *)local_78._M_allocated_capacity,(ulong)(local_68[0]._M_p + 1));
  }
  local_78._M_allocated_capacity = (size_type)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-o","");
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)&local_80,(string *)in_RDI);
  local_58._M_allocated_capacity = (size_type)&local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"--out","");
  Clara::addOptName((Arg *)local_80.functionObj,(string *)&local_58);
  local_a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"output filename","");
  std::__cxx11::string::_M_assign((string *)(local_80.functionObj + 1));
  local_c0._0_8_ = pAVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"filename","");
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData,std::__cxx11::string>
            ((ArgBuilder *)&local_80,0x28,(string *)local_c0);
  if ((Arg *)local_c0._0_8_ != pAVar3) {
    operator_delete((void *)local_c0._0_8_,(ulong)(local_c0._16_8_ + 1));
  }
  if ((pointer)local_a0._0_8_ != pcVar2) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_allocated_capacity != &local_48) {
    operator_delete((void *)local_58._M_allocated_capacity,
                    (ulong)(local_48._M_allocated_capacity + 1));
  }
  if ((_Alloc_hider *)local_78._M_allocated_capacity != local_68) {
    operator_delete((void *)local_78._M_allocated_capacity,(ulong)(local_68[0]._M_p + 1));
  }
  local_78._M_allocated_capacity = (size_type)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-r","");
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)&local_80,(string *)in_RDI);
  local_58._M_allocated_capacity = (size_type)&local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"--reporter","");
  Clara::addOptName((Arg *)local_80.functionObj,(string *)&local_58);
  local_a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a0,"reporter to use (defaults to console)","");
  std::__cxx11::string::_M_assign((string *)(local_80.functionObj + 1));
  local_c0._0_8_ = pAVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"name","");
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::
  bind<Catch::ConfigData,std::__cxx11::string_const&>
            ((ArgBuilder *)&local_80,addReporterName,(string *)local_c0);
  if ((Arg *)local_c0._0_8_ != pAVar3) {
    operator_delete((void *)local_c0._0_8_,(ulong)(local_c0._16_8_ + 1));
  }
  if ((pointer)local_a0._0_8_ != pcVar2) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_allocated_capacity != &local_48) {
    operator_delete((void *)local_58._M_allocated_capacity,
                    (ulong)(local_48._M_allocated_capacity + 1));
  }
  if ((_Alloc_hider *)local_78._M_allocated_capacity != local_68) {
    operator_delete((void *)local_78._M_allocated_capacity,(ulong)(local_68[0]._M_p + 1));
  }
  local_78._M_allocated_capacity = (size_type)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-n","");
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)&local_80,(string *)in_RDI);
  local_58._M_allocated_capacity = (size_type)&local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"--name","");
  Clara::addOptName((Arg *)local_80.functionObj,(string *)&local_58);
  local_a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"suite name","");
  std::__cxx11::string::_M_assign((string *)(local_80.functionObj + 1));
  local_c0._0_8_ = pAVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"name","");
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData,std::__cxx11::string>
            ((ArgBuilder *)&local_80,0x48,(string *)local_c0);
  if ((Arg *)local_c0._0_8_ != pAVar3) {
    operator_delete((void *)local_c0._0_8_,(ulong)(local_c0._16_8_ + 1));
  }
  if ((pointer)local_a0._0_8_ != pcVar2) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_allocated_capacity != &local_48) {
    operator_delete((void *)local_58._M_allocated_capacity,
                    (ulong)(local_48._M_allocated_capacity + 1));
  }
  if ((_Alloc_hider *)local_78._M_allocated_capacity != local_68) {
    operator_delete((void *)local_78._M_allocated_capacity,(ulong)(local_68[0]._M_p + 1));
  }
  local_78._M_allocated_capacity = (size_type)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-a","");
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_c0,(string *)in_RDI);
  local_58._M_allocated_capacity = (size_type)&local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"--abort","");
  Clara::addOptName((Arg *)local_c0._0_8_,(string *)&local_58);
  local_a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"abort at first failure","");
  std::__cxx11::string::_M_assign((string *)(local_c0._0_8_ + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)local_c0,abortAfterFirst);
  if ((pointer)local_a0._0_8_ != pcVar2) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_allocated_capacity != &local_48) {
    operator_delete((void *)local_58._M_allocated_capacity,
                    (ulong)(local_48._M_allocated_capacity + 1));
  }
  if ((_Alloc_hider *)local_78._M_allocated_capacity != local_68) {
    operator_delete((void *)local_78._M_allocated_capacity,(ulong)(local_68[0]._M_p + 1));
  }
  local_78._M_allocated_capacity = (size_type)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-x","");
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)&local_80,(string *)in_RDI);
  local_58._M_allocated_capacity = (size_type)&local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"--abortx","");
  Clara::addOptName((Arg *)local_80.functionObj,(string *)&local_58);
  local_a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"abort after x failures","");
  std::__cxx11::string::_M_assign((string *)(local_80.functionObj + 1));
  local_c0._0_8_ = pAVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"no. failures","");
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData,int>
            ((ArgBuilder *)&local_80,abortAfterX,(string *)local_c0);
  if ((Arg *)local_c0._0_8_ != pAVar3) {
    operator_delete((void *)local_c0._0_8_,(ulong)(local_c0._16_8_ + 1));
  }
  if ((pointer)local_a0._0_8_ != pcVar2) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_allocated_capacity != &local_48) {
    operator_delete((void *)local_58._M_allocated_capacity,
                    (ulong)(local_48._M_allocated_capacity + 1));
  }
  if ((_Alloc_hider *)local_78._M_allocated_capacity != local_68) {
    operator_delete((void *)local_78._M_allocated_capacity,(ulong)(local_68[0]._M_p + 1));
  }
  local_78._M_allocated_capacity = (size_type)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-w","");
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)&local_80,(string *)in_RDI);
  local_58._M_allocated_capacity = (size_type)&local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"--warn","");
  Clara::addOptName((Arg *)local_80.functionObj,(string *)&local_58);
  local_a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"enable warnings","");
  std::__cxx11::string::_M_assign((string *)(local_80.functionObj + 1));
  local_c0._0_8_ = pAVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"warning name","");
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::
  bind<Catch::ConfigData,std::__cxx11::string_const&>
            ((ArgBuilder *)&local_80,addWarning,(string *)local_c0);
  if ((Arg *)local_c0._0_8_ != pAVar3) {
    operator_delete((void *)local_c0._0_8_,(ulong)(local_c0._16_8_ + 1));
  }
  if ((pointer)local_a0._0_8_ != pcVar2) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_allocated_capacity != &local_48) {
    operator_delete((void *)local_58._M_allocated_capacity,
                    (ulong)(local_48._M_allocated_capacity + 1));
  }
  if ((_Alloc_hider *)local_78._M_allocated_capacity != local_68) {
    operator_delete((void *)local_78._M_allocated_capacity,(ulong)(local_68[0]._M_p + 1));
  }
  local_a0._0_8_ = Clara::CommandLine<Catch::ConfigData>::operator[]();
  local_78._M_allocated_capacity = (size_type)local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"which test or tests to use","");
  std::__cxx11::string::_M_assign((string *)(local_a0._0_8_ + 8));
  local_58._M_allocated_capacity = (size_type)&local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"test name, pattern or tags","");
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::
  bind<Catch::ConfigData,std::__cxx11::string_const&>
            ((ArgBuilder *)local_a0,addTestOrTags,(string *)&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_allocated_capacity != &local_48) {
    operator_delete((void *)local_58._M_allocated_capacity,
                    (ulong)(local_48._M_allocated_capacity + 1));
  }
  if ((_Alloc_hider *)local_78._M_allocated_capacity != local_68) {
    operator_delete((void *)local_78._M_allocated_capacity,(ulong)(local_68[0]._M_p + 1));
  }
  local_78._M_allocated_capacity = (size_type)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-d","");
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)&local_80,(string *)in_RDI);
  local_58._M_allocated_capacity = (size_type)&local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"--durations","");
  Clara::addOptName((Arg *)local_80.functionObj,(string *)&local_58);
  local_a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"show test durations","");
  std::__cxx11::string::_M_assign((string *)(local_80.functionObj + 1));
  local_c0._0_8_ = pAVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"yes|no","");
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData,bool>
            ((ArgBuilder *)&local_80,setShowDurations,(string *)local_c0);
  if ((Arg *)local_c0._0_8_ != pAVar3) {
    operator_delete((void *)local_c0._0_8_,(ulong)(local_c0._16_8_ + 1));
  }
  if ((pointer)local_a0._0_8_ != pcVar2) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_allocated_capacity != &local_48) {
    operator_delete((void *)local_58._M_allocated_capacity,
                    (ulong)(local_48._M_allocated_capacity + 1));
  }
  if ((_Alloc_hider *)local_78._M_allocated_capacity != local_68) {
    operator_delete((void *)local_78._M_allocated_capacity,(ulong)(local_68[0]._M_p + 1));
  }
  local_78._M_allocated_capacity = (size_type)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-f","");
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)&local_80,(string *)in_RDI);
  local_58._M_allocated_capacity = (size_type)&local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"--input-file","");
  Clara::addOptName((Arg *)local_80.functionObj,(string *)&local_58);
  local_a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a0,"load test names to run from a file","");
  std::__cxx11::string::_M_assign((string *)(local_80.functionObj + 1));
  local_c0._0_8_ = pAVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"filename","");
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::
  bind<Catch::ConfigData,std::__cxx11::string_const&>
            ((ArgBuilder *)&local_80,loadTestNamesFromFile,(string *)local_c0);
  if ((Arg *)local_c0._0_8_ != pAVar3) {
    operator_delete((void *)local_c0._0_8_,(ulong)(local_c0._16_8_ + 1));
  }
  if ((pointer)local_a0._0_8_ != pcVar2) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_allocated_capacity != &local_48) {
    operator_delete((void *)local_58._M_allocated_capacity,
                    (ulong)(local_48._M_allocated_capacity + 1));
  }
  if ((_Alloc_hider *)local_78._M_allocated_capacity != local_68) {
    operator_delete((void *)local_78._M_allocated_capacity,(ulong)(local_68[0]._M_p + 1));
  }
  local_78._M_allocated_capacity = (size_type)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-#","");
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_c0,(string *)in_RDI);
  local_58._M_allocated_capacity = (size_type)&local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"--filenames-as-tags","");
  Clara::addOptName((Arg *)local_c0._0_8_,(string *)&local_58);
  local_a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a0,"adds a tag for the filename","");
  std::__cxx11::string::_M_assign((string *)(local_c0._0_8_ + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)local_c0,9);
  if ((pointer)local_a0._0_8_ != pcVar2) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_allocated_capacity != &local_48) {
    operator_delete((void *)local_58._M_allocated_capacity,
                    (ulong)(local_48._M_allocated_capacity + 1));
  }
  if ((_Alloc_hider *)local_78._M_allocated_capacity != local_68) {
    operator_delete((void *)local_78._M_allocated_capacity,(ulong)(local_68[0]._M_p + 1));
  }
  local_78._M_allocated_capacity = (size_type)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"--list-test-names-only","");
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_a0,(string *)in_RDI);
  local_58._M_allocated_capacity = (size_type)&local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"list all/matching test cases names only","");
  std::__cxx11::string::_M_assign((string *)(local_a0._0_8_ + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)local_a0,3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_allocated_capacity != &local_48) {
    operator_delete((void *)local_58._M_allocated_capacity,
                    (ulong)(local_48._M_allocated_capacity + 1));
  }
  if ((_Alloc_hider *)local_78._M_allocated_capacity != local_68) {
    operator_delete((void *)local_78._M_allocated_capacity,(ulong)(local_68[0]._M_p + 1));
  }
  local_78._M_allocated_capacity = (size_type)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"--list-reporters","");
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_a0,(string *)in_RDI);
  local_58._M_allocated_capacity = (size_type)&local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"list all reporters","");
  std::__cxx11::string::_M_assign((string *)(local_a0._0_8_ + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)local_a0,2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_allocated_capacity != &local_48) {
    operator_delete((void *)local_58._M_allocated_capacity,
                    (ulong)(local_48._M_allocated_capacity + 1));
  }
  if ((_Alloc_hider *)local_78._M_allocated_capacity != local_68) {
    operator_delete((void *)local_78._M_allocated_capacity,(ulong)(local_68[0]._M_p + 1));
  }
  local_78._M_allocated_capacity = (size_type)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"--order","");
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_c0,(string *)in_RDI);
  local_58._M_allocated_capacity = (size_type)&local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"test case order (defaults to decl)","");
  std::__cxx11::string::_M_assign((string *)(local_c0._0_8_ + 8));
  local_a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"decl|lex|rand","");
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::
  bind<Catch::ConfigData,std::__cxx11::string_const&>
            ((ArgBuilder *)local_c0,setOrder,(string *)local_a0);
  if ((pointer)local_a0._0_8_ != pcVar2) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_allocated_capacity != &local_48) {
    operator_delete((void *)local_58._M_allocated_capacity,
                    (ulong)(local_48._M_allocated_capacity + 1));
  }
  if ((_Alloc_hider *)local_78._M_allocated_capacity != local_68) {
    operator_delete((void *)local_78._M_allocated_capacity,(ulong)(local_68[0]._M_p + 1));
  }
  local_78._M_allocated_capacity = (size_type)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"--rng-seed","");
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_c0,(string *)in_RDI);
  local_58._M_allocated_capacity = (size_type)&local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"set a specific seed for random numbers","");
  std::__cxx11::string::_M_assign((string *)(local_c0._0_8_ + 8));
  local_a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"\'time\'|number","");
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::
  bind<Catch::ConfigData,std::__cxx11::string_const&>
            ((ArgBuilder *)local_c0,setRngSeed,(string *)local_a0);
  if ((pointer)local_a0._0_8_ != pcVar2) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_allocated_capacity != &local_48) {
    operator_delete((void *)local_58._M_allocated_capacity,
                    (ulong)(local_48._M_allocated_capacity + 1));
  }
  if ((_Alloc_hider *)local_78._M_allocated_capacity != local_68) {
    operator_delete((void *)local_78._M_allocated_capacity,(ulong)(local_68[0]._M_p + 1));
  }
  local_78._M_allocated_capacity = (size_type)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"--force-colour","");
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_a0,(string *)in_RDI);
  local_58._M_allocated_capacity = (size_type)&local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"force colourised output (deprecated)","");
  std::__cxx11::string::_M_assign((string *)(local_a0._0_8_ + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)local_a0,forceColour);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_allocated_capacity != &local_48) {
    operator_delete((void *)local_58._M_allocated_capacity,
                    (ulong)(local_48._M_allocated_capacity + 1));
  }
  if ((_Alloc_hider *)local_78._M_allocated_capacity != local_68) {
    operator_delete((void *)local_78._M_allocated_capacity,(ulong)(local_68[0]._M_p + 1));
  }
  local_78._M_allocated_capacity = (size_type)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"--use-colour","");
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_c0,(string *)in_RDI);
  local_58._M_allocated_capacity = (size_type)&local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"should output be colourised","");
  std::__cxx11::string::_M_assign((string *)(local_c0._0_8_ + 8));
  local_a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"yes|no","");
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::
  bind<Catch::ConfigData,std::__cxx11::string_const&>
            ((ArgBuilder *)local_c0,setUseColour,(string *)local_a0);
  if ((pointer)local_a0._0_8_ != pcVar2) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_allocated_capacity != &local_48) {
    operator_delete((void *)local_58._M_allocated_capacity,
                    (ulong)(local_48._M_allocated_capacity + 1));
  }
  if ((_Alloc_hider *)local_78._M_allocated_capacity != local_68) {
    operator_delete((void *)local_78._M_allocated_capacity,(ulong)(local_68[0]._M_p + 1));
  }
  return in_RDI;
}

Assistant:

inline Clara::CommandLine<ConfigData> makeCommandLineParser() {

        using namespace Clara;
        CommandLine<ConfigData> cli;

        cli.bindProcessName( &ConfigData::processName );

        cli["-?"]["-h"]["--help"]
            .describe( "display usage information" )
            .bind( &ConfigData::showHelp );

        cli["-l"]["--list-tests"]
            .describe( "list all/matching test cases" )
            .bind( &ConfigData::listTests );

        cli["-t"]["--list-tags"]
            .describe( "list all/matching tags" )
            .bind( &ConfigData::listTags );

        cli["-s"]["--success"]
            .describe( "include successful tests in output" )
            .bind( &ConfigData::showSuccessfulTests );

        cli["-b"]["--break"]
            .describe( "break into debugger on failure" )
            .bind( &ConfigData::shouldDebugBreak );

        cli["-e"]["--nothrow"]
            .describe( "skip exception tests" )
            .bind( &ConfigData::noThrow );

        cli["-i"]["--invisibles"]
            .describe( "show invisibles (tabs, newlines)" )
            .bind( &ConfigData::showInvisibles );

        cli["-o"]["--out"]
            .describe( "output filename" )
            .bind( &ConfigData::outputFilename, "filename" );

        cli["-r"]["--reporter"]
//            .placeholder( "name[:filename]" )
            .describe( "reporter to use (defaults to console)" )
            .bind( &addReporterName, "name" );

        cli["-n"]["--name"]
            .describe( "suite name" )
            .bind( &ConfigData::name, "name" );

        cli["-a"]["--abort"]
            .describe( "abort at first failure" )
            .bind( &abortAfterFirst );

        cli["-x"]["--abortx"]
            .describe( "abort after x failures" )
            .bind( &abortAfterX, "no. failures" );

        cli["-w"]["--warn"]
            .describe( "enable warnings" )
            .bind( &addWarning, "warning name" );

// - needs updating if reinstated
//        cli.into( &setVerbosity )
//            .describe( "level of verbosity (0=no output)" )
//            .shortOpt( "v")
//            .longOpt( "verbosity" )
//            .placeholder( "level" );

        cli[_]
            .describe( "which test or tests to use" )
            .bind( &addTestOrTags, "test name, pattern or tags" );

        cli["-d"]["--durations"]
            .describe( "show test durations" )
            .bind( &setShowDurations, "yes|no" );

        cli["-f"]["--input-file"]
            .describe( "load test names to run from a file" )
            .bind( &loadTestNamesFromFile, "filename" );

        cli["-#"]["--filenames-as-tags"]
            .describe( "adds a tag for the filename" )
            .bind( &ConfigData::filenamesAsTags );

        // Less common commands which don't have a short form
        cli["--list-test-names-only"]
            .describe( "list all/matching test cases names only" )
            .bind( &ConfigData::listTestNamesOnly );

        cli["--list-reporters"]
            .describe( "list all reporters" )
            .bind( &ConfigData::listReporters );

        cli["--order"]
            .describe( "test case order (defaults to decl)" )
            .bind( &setOrder, "decl|lex|rand" );

        cli["--rng-seed"]
            .describe( "set a specific seed for random numbers" )
            .bind( &setRngSeed, "'time'|number" );

        cli["--force-colour"]
            .describe( "force colourised output (deprecated)" )
            .bind( &forceColour );

        cli["--use-colour"]
            .describe( "should output be colourised" )
            .bind( &setUseColour, "yes|no" );

        return cli;
    }